

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

ImGuiContext * ImGui::CreateContext(ImFontAtlas *shared_font_atlas)

{
  ImGuiContext *ctx_00;
  ImGuiContext *ctx_01;
  ImGuiContext *ctx;
  ImGuiContext *prev_ctx;
  ImFontAtlas *in_stack_00000178;
  ImGuiContext *in_stack_00000180;
  size_t in_stack_ffffffffffffffc0;
  
  ctx_00 = GetCurrentContext();
  MemAlloc(in_stack_ffffffffffffffc0);
  ctx_01 = (ImGuiContext *)::operator_new(0x5db0);
  ImGuiContext::ImGuiContext(in_stack_00000180,in_stack_00000178);
  SetCurrentContext(ctx_01);
  Initialize();
  if (ctx_00 != (ImGuiContext *)0x0) {
    SetCurrentContext(ctx_00);
  }
  return ctx_01;
}

Assistant:

ImGuiContext* ImGui::CreateContext(ImFontAtlas* shared_font_atlas)
{
    ImGuiContext* prev_ctx = GetCurrentContext();
    ImGuiContext* ctx = IM_NEW(ImGuiContext)(shared_font_atlas);
    SetCurrentContext(ctx);
    Initialize();
    if (prev_ctx != NULL)
        SetCurrentContext(prev_ctx); // Restore previous context if any, else keep new one.
    return ctx;
}